

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Relational(DataParser *parser)

{
  bool bVar1;
  char cVar2;
  bool looping;
  DataParser *parser_local;
  
  Additive(parser);
  bVar1 = true;
  while (bVar1) {
    cVar2 = DataParser::Look(parser);
    switch(cVar2) {
    case '!':
      NotEqual(parser);
      break;
    default:
      bVar1 = false;
      break;
    case '<':
      Less(parser);
      break;
    case '=':
      Equal(parser);
      break;
    case '>':
      Greater(parser);
    }
  }
  return;
}

Assistant:

static void Relational(DataParser& parser)
	{
		Additive(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '=': Equal(parser); break;
			case '!': NotEqual(parser); break;
			case '<': Less(parser); break;
			case '>': Greater(parser); break;
			default: looping = false;
			}
		}
	}